

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_SetUnlockingScript_Test::TestBody
          (AbstractTransaction_SetUnlockingScript_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *message;
  AssertionResult gtest_ar;
  Transaction tx;
  undefined1 local_168 [56];
  string local_130;
  string local_110;
  AbstractTxInReference local_f0;
  Transaction local_60;
  
  cfd::core::Transaction::Transaction(&local_60,2,3);
  paVar1 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_168,&local_110);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,"76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac","");
  cfd::core::Script::Script((Script *)&local_f0,&local_130);
  cfd::core::Transaction::AddTxIn(&local_60,(Txid *)local_168,0,0xffffffff,(Script *)&local_f0);
  cfd::core::Script::~Script((Script *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_168._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_168._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Script::Script((Script *)&local_f0);
    cfd::core::Transaction::SetUnlockingScript(&local_60,3,(Script *)&local_f0);
    cfd::core::Script::~Script((Script *)&local_f0);
  }
  testing::Message::Message((Message *)&local_f0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_168,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0x95,
             "Expected: tx.SetUnlockingScript(3, Script()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)&local_f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
  if (local_f0._vptr_AbstractTxInReference != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_f0._vptr_AbstractTxInReference != (_func_int **)0x0)) {
      (**(code **)(*local_f0._vptr_AbstractTxInReference + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_168._0_8_ = (AssertHelperData *)(local_168 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"61","");
    cfd::core::Script::Script((Script *)&local_f0,(string *)local_168);
    cfd::core::Transaction::SetUnlockingScript(&local_60,0,(Script *)&local_f0);
    cfd::core::Script::~Script((Script *)&local_f0);
    if ((AssertHelperData *)local_168._0_8_ != (AssertHelperData *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_f0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_168,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
             ,0x96,
             "Expected: tx.SetUnlockingScript(0, Script(\"61\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)&local_f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
  if (local_f0._vptr_AbstractTxInReference != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_f0._vptr_AbstractTxInReference != (_func_int **)0x0)) {
      (**(code **)(*local_f0._vptr_AbstractTxInReference + 8))();
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_168._0_8_ = (AssertHelperData *)(local_168 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,
                 "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"
                 ,"");
      cfd::core::Script::Script((Script *)&local_f0,(string *)local_168);
      cfd::core::Transaction::SetUnlockingScript(&local_60,0,(Script *)&local_f0);
      cfd::core::Script::~Script((Script *)&local_f0);
      if ((AssertHelperData *)local_168._0_8_ != (AssertHelperData *)(local_168 + 0x10)) {
        operator_delete((void *)local_168._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x9c,
               "Expected: tx.SetUnlockingScript( 0, Script( \"47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if (local_f0._vptr_AbstractTxInReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_f0._vptr_AbstractTxInReference != (_func_int **)0x0)) {
        (**(code **)(*local_f0._vptr_AbstractTxInReference + 8))();
      }
    }
  }
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_f0,&local_60,0);
  cfd::core::Script::Script((Script *)local_168,&local_f0.unlocking_script_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_110,(Script *)local_168);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_130,"tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str()",
             "\"47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763\""
             ,local_110._M_dataplus._M_p,
             "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)local_168);
  cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_f0);
  if ((char)local_130._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_130._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_130._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0xa0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_168,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_168);
    if (local_f0._vptr_AbstractTxInReference != (_func_int **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_f0._vptr_AbstractTxInReference != (_func_int **)0x0)) {
        (**(code **)(*local_f0._vptr_AbstractTxInReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_130._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::~Transaction(&local_60);
  return;
}

Assistant:

TEST(AbstractTransaction, SetUnlockingScript) {
  int32_t version = 2;
  uint32_t locktime = 3;
  uint32_t vout = 0;
  uint32_t seq = 0xffffffff;

  Transaction tx(version, locktime);
  tx.AddTxIn(
      Txid("e9f71e1f6787f47af671b62f4e29bda856ec3d51a817c62e1cea7f9f0c0190b6"),
      vout, seq, Script("76a914100358d754597ca2f010f6d84f4a0fe74f71f7bb88ac"));

  // error
  EXPECT_THROW(tx.SetUnlockingScript(3, Script()), CfdException);
  EXPECT_THROW(tx.SetUnlockingScript(0, Script("61")), CfdException);

  EXPECT_NO_THROW(
      tx.SetUnlockingScript(
          0,
          Script(
              "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763")));

  EXPECT_STREQ(
      tx.GetTxIn(0).GetUnlockingScript().GetHex().c_str(),
      "47304402201934f30b8a2edc4554961b63ca7d540332d5d2f2769727113676b37e4e8ca7c5022076c5bd921d9c08e1c00d58d27bcef918bf025028a9a91f0f545d18a93dda5860012102158a304e6dc2225de38fcd378d6252782085b1f316d6747414ae616d82780763");
}